

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decay.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,'\n');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,'\n');
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,'\n');
  decay((int *)poVar1);
  return 0;
}

Assistant:

int main() {
  int ages[] = { 15, 30, 60 };
  // Number of elements = 3
  std::cout << std::size(ages) << '\n';
  // Size of an element = 4
  std::cout << sizeof(ages[0]) << '\n';
  // Size of array = 12 (= 3 * 4)
  std::cout << sizeof(ages) << '\n';
  decay(ages);
}